

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

int __thiscall glslang::TInputScanner::get(TInputScanner *this)

{
  int iVar1;
  int ret;
  TInputScanner *this_local;
  
  iVar1 = peek(this);
  if (iVar1 != -1) {
    this->loc[this->currentSource].column = this->loc[this->currentSource].column + 1;
    (this->logicalSourceLoc).column = (this->logicalSourceLoc).column + 1;
    if (iVar1 == 10) {
      this->loc[this->currentSource].line = this->loc[this->currentSource].line + 1;
      (this->logicalSourceLoc).line = (this->logicalSourceLoc).line + 1;
      (this->logicalSourceLoc).column = 0;
      this->loc[this->currentSource].column = 0;
    }
    advance(this);
  }
  return iVar1;
}

Assistant:

int get()
    {
        int ret = peek();
        if (ret == EndOfInput)
            return ret;
        ++loc[currentSource].column;
        ++logicalSourceLoc.column;
        if (ret == '\n') {
            ++loc[currentSource].line;
            ++logicalSourceLoc.line;
            logicalSourceLoc.column = 0;
            loc[currentSource].column = 0;
        }
        advance();

        return ret;
    }